

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O2

ErrorStackOption * __thiscall
ritobin::io::json_impl::json_value_impl<ritobin::List,_(ritobin::Category)6>::from_json
          (ErrorStackOption *__return_storage_ptr__,
          json_value_impl<ritobin::List,_(ritobin::Category)6> *this,List *value,json *json)

{
  bool bVar1;
  const_reference pvVar2;
  reference json_00;
  reference value_00;
  size_t index;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  json_impl *this_00;
  string_view type_name;
  string valueType_name;
  const_iterator __end3;
  const_iterator __begin3;
  allocator<char> local_141;
  undefined1 local_140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120 [2];
  json_value_impl<ritobin::List,_(ritobin::Category)6> *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  const_iterator local_70;
  const_iterator local_50;
  
  if (value->valueType == BOOL) {
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[10],_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)value,(char (*) [10])"valueType");
    if (bVar1) {
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[6],_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)value,(char (*) [6])"items");
      if (bVar1) {
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)value,"valueType");
        if (pvVar2->m_type == string) {
          pvVar2 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)value,"items");
          if (pvVar2->m_type == array) {
            pvVar2 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)value,"valueType");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                       ,pvVar2);
            type_name._M_str = (char *)this;
            type_name._M_len = local_f0[0]._M_allocated_capacity;
            bVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                    ::try_type_name_to_type
                              ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                                *)local_f0[0]._8_8_,type_name,&json->m_type);
            if (bVar1) {
              pvVar2 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)value,"items");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::cbegin(&local_50,pvVar2);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::cend(&local_70,pvVar2);
              local_f8 = this + 8;
              this_00 = (json_impl *)0x0;
              while( true ) {
                bVar1 = nlohmann::detail::
                        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::operator!=(&local_50,&local_70);
                if (!bVar1) break;
                json_00 = nlohmann::detail::
                          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::operator*(&local_50);
                ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                ::type_to_value((Value *)local_140,(Type)*this);
                value_00 = std::vector<ritobin::Element,std::allocator<ritobin::Element>>::
                           emplace_back<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>
                                     ((vector<ritobin::Element,std::allocator<ritobin::Element>> *)
                                      local_f8,(Value *)local_140);
                std::__detail::__variant::
                _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                     *)local_140);
                item_from_json(__return_storage_ptr__,value_00,json_00);
                if ((__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged ==
                    true) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_d0[0]._M_local_buf,"items",&local_141);
                  to_index((string *)local_140,(string *)local_d0);
                  to_index_abi_cxx11_(&local_b0,this_00,index);
                  std::operator+(&local_90,(string *)local_140,&local_b0);
                  ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_90);
                  std::__cxx11::string::~string((string *)&local_90);
                  std::__cxx11::string::~string((string *)&local_b0);
                  std::__cxx11::string::~string((string *)local_140);
                  paVar3 = local_d0;
                  goto LAB_00121a7c;
                }
                std::_Optional_payload_base<ritobin::io::json_impl::ErrorStack>::_M_reset
                          ((_Optional_payload_base<ritobin::io::json_impl::ErrorStack> *)
                           __return_storage_ptr__);
                this_00 = this_00 + 1;
                nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator++(&local_50);
              }
              (__return_storage_ptr__->
              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
              super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
            }
            else {
              paVar3 = &local_130;
              local_140._0_8_ = "list";
              local_140._8_8_ =
                   "ValueHelper::try_type_name_to_type(valueType_name, value.valueType)";
              local_130._M_allocated_capacity = (size_type)local_120;
              local_130._8_8_ = 0;
              local_120[0]._M_local_buf[0] = '\0';
              std::optional<ritobin::io::json_impl::ErrorStack>::
              optional<ritobin::io::json_impl::ErrorStack,_true>
                        (__return_storage_ptr__,(ErrorStack *)local_140);
LAB_00121a7c:
              std::__cxx11::string::~string((string *)paVar3->_M_local_buf);
            }
            paVar3 = local_f0;
            goto LAB_00121993;
          }
          local_140._8_8_ = "json[\"items\"].is_array()";
        }
        else {
          local_140._8_8_ = "json[\"valueType\"].is_string()";
        }
      }
      else {
        local_140._8_8_ = "json.contains(\"items\")";
      }
    }
    else {
      local_140._8_8_ = "json.contains(\"valueType\")";
    }
  }
  else {
    local_140._8_8_ = "json.is_object()";
  }
  local_140._0_8_ = "list";
  paVar3 = &local_130;
  local_130._M_allocated_capacity = (size_type)local_120;
  local_130._8_8_ = 0;
  local_120[0]._M_local_buf[0] = '\0';
  std::optional<ritobin::io::json_impl::ErrorStack>::
  optional<ritobin::io::json_impl::ErrorStack,_true>(__return_storage_ptr__,(ErrorStack *)local_140)
  ;
LAB_00121993:
  std::__cxx11::string::~string((string *)paVar3->_M_local_buf);
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("valueType"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(json["valueType"].is_string());
            bin_json_assert(json["items"].is_array());
            std::string valueType_name = json["valueType"];
            bin_json_assert(ValueHelper::try_type_name_to_type(valueType_name, value.valueType));
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back(ValueHelper::type_to_value(value.valueType));
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }